

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

int __thiscall
opengv::relative_pose::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  double *pdVar2;
  RelativeAdapterBase *pRVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  PointerType ptr;
  Indices *pIVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 auVar50 [16];
  double dVar51;
  double dVar52;
  double dVar53;
  translation_t cam2Offset;
  rotation_t directRotation;
  rotation_t cam1Rotation;
  bearingVector_t f1;
  bearingVector_t f2;
  translation_t cam1Offset;
  rotation_t rotation;
  rotation_t cam2Rotation;
  cayley_t cayley;
  double local_318;
  double dStack_310;
  double local_2f8;
  double dStack_2f0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8 [2];
  double local_2a8 [4];
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double local_258;
  double dStack_250;
  ulong local_248;
  double dStack_240;
  double dStack_238;
  undefined8 local_230;
  double local_228;
  double dStack_220;
  double local_218;
  undefined1 local_208 [16];
  double local_1f8;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  double local_1c8;
  long local_1c0;
  point_t *local_1b8;
  long local_1b0;
  undefined8 local_1a8;
  double local_198;
  double dStack_190;
  undefined1 local_188 [16];
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  undefined1 local_158 [16];
  double local_148;
  double dStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  undefined1 local_108 [16];
  double local_f8;
  undefined1 local_e8 [16];
  double local_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  undefined1 local_b8 [16];
  double local_a8 [10];
  cayley_t local_58;
  
  pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_198 = *pdVar2;
  dStack_190 = pdVar2[1];
  dVar1 = pdVar2[2];
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pdVar2[3];
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar2[4];
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar2[5];
  math::cayley2rot(&local_58);
  pIVar20 = this->_indices;
  if (pIVar20->_numberCorrespondences != 0) {
    uVar23 = 0;
    pdVar2 = local_a8 + 1;
    do {
      iVar22 = (int)uVar23;
      iVar19 = iVar22;
      if (pIVar20->_useIndices == true) {
        iVar19 = (pIVar20->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[5])(local_108,this->_adapter,(long)iVar19);
      iVar19 = iVar22;
      if (this->_indices->_useIndices == true) {
        iVar19 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[6])(&local_258,this->_adapter,(long)iVar19);
      iVar19 = iVar22;
      if (this->_indices->_useIndices == true) {
        iVar19 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[7])(&local_2c8,this->_adapter,(long)iVar19);
      iVar19 = iVar22;
      if (this->_indices->_useIndices == true) {
        iVar19 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[8])(pdVar2,this->_adapter,(long)iVar19);
      auVar27._8_8_ = dStack_190;
      auVar27._0_8_ = local_198;
      auVar25 = vsubpd_avx(auVar27,local_108);
      auVar18._8_8_ = dStack_c8;
      auVar18._0_8_ = local_d0;
      auVar35._8_8_ = local_2b8[0];
      auVar35._0_8_ = local_2b8[0];
      auVar17._8_8_ = local_d0;
      auVar17._0_8_ = local_d8;
      auVar24._8_8_ = local_2c8;
      auVar24._0_8_ = local_2c8;
      auVar24 = vmulpd_avx512vl(local_e8,auVar24);
      auVar26._8_8_ = dStack_2c0;
      auVar26._0_8_ = dStack_2c0;
      auVar24 = vfmadd231pd_avx512vl(auVar24,auVar18,auVar26);
      auVar24 = vfmadd231pd_fma(auVar24,local_b8,auVar35);
      dVar28 = auVar25._0_8_ + auVar24._0_8_;
      dVar32 = auVar25._8_8_ + auVar24._8_8_;
      auVar45._8_8_ = local_c0;
      auVar45._0_8_ = local_c0;
      auVar24 = vunpcklpd_avx(auVar17,auVar45);
      auVar47._0_8_ = auVar24._0_8_ * local_2c8;
      auVar47._8_8_ = auVar24._8_8_ * dStack_2c0;
      auVar25 = vshufpd_avx(auVar47,auVar47,1);
      dVar33 = (dVar1 - local_f8) + auVar47._0_8_ + auVar25._0_8_ + local_a8[0] * local_2b8[0];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_248;
      auVar25 = vmovhpd_avx(auVar50,local_230);
      dVar52 = dVar28 * local_258 + dVar32 * dStack_250 + auVar25._0_8_ * dVar33;
      dVar53 = dVar28 * dStack_240 + dVar32 * dStack_238 + auVar25._8_8_ * dVar33;
      dVar28 = dVar28 * local_228;
      dVar32 = dVar32 * dStack_220;
      dVar33 = dVar33 * local_218;
      auVar25._8_8_ = dStack_240;
      auVar25._0_8_ = local_248;
      dVar4 = local_e8._0_8_;
      dVar34 = local_e8._8_8_;
      auVar25 = vmovhpd_avx(auVar25,local_230);
      dVar49 = auVar25._0_8_;
      dVar51 = auVar25._8_8_;
      auVar36._0_8_ = local_258 * dVar4 + dStack_250 * dVar34 + dVar49 * local_d8;
      auVar36._8_8_ = dStack_240 * dVar4 + dStack_238 * dVar34 + dVar51 * local_d8;
      auVar40._0_8_ = dVar49 * local_c0 + local_258 * local_d0 + dStack_250 * dStack_c8;
      auVar40._8_8_ = dVar51 * local_c0 + dStack_240 * local_d0 + dStack_238 * dStack_c8;
      auVar43._0_8_ = auVar24._0_8_ * local_218 + local_228 * dVar4 + dStack_220 * dVar34;
      auVar43._8_8_ = auVar24._8_8_ * local_218 + local_228 * local_d0 + dStack_220 * dStack_c8;
      local_1f8 = (double)vmovlpd_avx(auVar43);
      local_1e0 = vmovhpd_avx(auVar43);
      dVar4 = local_b8._0_8_;
      dVar34 = local_b8._8_8_;
      auVar44._0_8_ = local_a8[0] * dVar49 + local_258 * dVar4 + dStack_250 * dVar34;
      auVar44._8_8_ = local_a8[0] * dVar51 + dStack_240 * dVar4 + dStack_238 * dVar34;
      dVar4 = local_a8[0] * local_218 + local_228 * dVar4 + dStack_220 * dVar34;
      local_1a8 = 3;
      lVar21 = 0x10;
      local_208 = auVar36;
      local_1f0 = auVar40;
      local_1d8 = auVar44;
      local_1c8 = dVar4;
      local_1c0 = (long)pdVar2;
      local_1b8 = (point_t *)local_208;
      local_1b0 = (long)pdVar2;
      do {
        dVar34 = *(double *)((long)local_a8 + lVar21 + 8U);
        auVar46._8_8_ = dVar34;
        auVar46._0_8_ = dVar34;
        auVar5._8_8_ = *(undefined8 *)(local_b8 + lVar21 + 8);
        auVar5._0_8_ = *(undefined8 *)(local_b8 + lVar21 + 8);
        auVar25 = vmulpd_avx512vl(auVar36,auVar5);
        auVar6._8_8_ = *(undefined8 *)((long)local_a8 + lVar21);
        auVar6._0_8_ = *(undefined8 *)((long)local_a8 + lVar21);
        auVar25 = vfmadd231pd_avx512vl(auVar25,auVar40,auVar6);
        auVar25 = vfmadd231pd_fma(auVar25,auVar44,auVar46);
        *(undefined1 (*) [16])((long)local_2b8 + lVar21) = auVar25;
        auVar48._0_8_ = auVar43._0_8_ * *(double *)(local_b8 + lVar21 + 8);
        auVar48._8_8_ = auVar43._8_8_ * *(double *)((long)local_a8 + lVar21);
        auVar25 = vshufpd_avx(auVar48,auVar48,1);
        *(double *)((long)local_2a8 + lVar21) = auVar48._0_8_ + auVar25._0_8_ + dVar4 * dVar34;
        lVar21 = lVar21 + 0x18;
      } while (lVar21 != 0x58);
      dVar33 = dVar33 + dVar28 + dVar32;
      pRVar3 = this->_adapter;
      (pRVar3->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = dVar52;
      (pRVar3->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = dVar53;
      (pRVar3->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = dVar33;
      pRVar3 = this->_adapter;
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = local_2a8[0];
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = local_2a8[1];
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = local_2a8[2];
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = local_2a8[3];
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = local_288;
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = dStack_280;
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = local_278;
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = dStack_270;
      local_138 = local_268;
      uStack_130 = 0;
      (pRVar3->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = local_268;
      auVar11._8_8_ = local_2a8[1];
      auVar11._0_8_ = local_2a8[0];
      auVar25 = vpinsrq_avx(auVar11,local_2a8[3],1);
      auVar12._8_8_ = local_2a8[2];
      auVar12._0_8_ = local_2a8[1];
      auVar24 = vpinsrq_avx(auVar12,local_288,1);
      local_148 = local_278;
      dStack_140 = dStack_270;
      auVar13._8_8_ = local_2a8[3];
      auVar13._0_8_ = local_2a8[2];
      local_158 = vpinsrq_avx(auVar13,dStack_280,1);
      iVar19 = iVar22;
      if (this->_indices->_useIndices == true) {
        iVar19 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      triangulation::triangulate2((point_t *)local_208,this->_adapter,(long)iVar19);
      local_168 = (double)local_208._0_8_;
      dStack_160 = (double)local_208._8_8_;
      auVar7._8_8_ = local_208._0_8_;
      auVar7._0_8_ = local_208._0_8_;
      auVar26 = vmulpd_avx512vl(auVar25,auVar7);
      auVar8._8_8_ = local_208._8_8_;
      auVar8._0_8_ = local_208._8_8_;
      local_188 = vfmadd231pd_avx512vl(auVar26,auVar24,auVar8);
      local_178 = local_1f8;
      dStack_170 = local_1f8;
      iVar19 = iVar22;
      if (this->_indices->_useIndices == true) {
        iVar19 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      (*this->_adapter->_vptr_RelativeAdapterBase[2])
                ((point_t *)local_208,this->_adapter,(long)iVar19);
      if (this->_indices->_useIndices == true) {
        iVar22 = (this->_indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      auVar10._8_8_ = dVar53;
      auVar10._0_8_ = dVar52;
      local_318 = auVar25._0_8_;
      dStack_310 = auVar25._8_8_;
      auVar29._0_8_ = dVar52 * local_318;
      auVar29._8_8_ = dVar52 * dStack_310;
      auVar25 = vshufpd_avx(auVar10,auVar10,3);
      auVar25 = vfnmsub132pd_fma(auVar25,auVar29,auVar24);
      auVar30._8_8_ = dVar33;
      auVar30._0_8_ = dVar33;
      auVar26 = vfnmadd213pd_fma(auVar30,local_158,auVar25);
      auVar16._8_8_ = uStack_130;
      auVar16._0_8_ = local_138;
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar27 = vxorpd_avx512vl(auVar16,auVar9);
      auVar37._0_8_ = dVar52 * local_148;
      auVar37._8_8_ = dVar53 * dStack_140;
      auVar25 = vshufpd_avx(auVar37,auVar37,1);
      auVar14._8_8_ = dStack_170;
      auVar14._0_8_ = local_178;
      auVar24 = vfmadd231pd_fma(local_188,auVar14,local_158);
      auVar31._0_8_ = auVar26._0_8_ + auVar24._0_8_;
      auVar31._8_8_ = auVar26._8_8_ + auVar24._8_8_;
      auVar15._8_8_ = dStack_160;
      auVar15._0_8_ = local_168;
      dVar4 = local_168 * local_148 + dStack_160 * dStack_140 +
              local_178 * local_138 + ((dVar33 * auVar27._0_8_ - auVar25._0_8_) - auVar37._0_8_);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_178 * local_178 + local_168 * local_168 + dStack_160 * dStack_160;
      auVar25 = vsqrtpd_avx(auVar38);
      dVar33 = auVar25._0_8_;
      auVar41._8_8_ = dVar33;
      auVar41._0_8_ = dVar33;
      auVar25 = vdivpd_avx(auVar15,auVar41);
      dVar33 = local_178 / dVar33;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = auVar31._0_8_ * auVar31._0_8_ + auVar31._8_8_ * auVar31._8_8_ + dVar4 * dVar4;
      auVar24 = vsqrtpd_avx(auVar39);
      dVar34 = auVar24._0_8_;
      auVar42._8_8_ = dVar34;
      auVar42._0_8_ = dVar34;
      auVar24 = vdivpd_avx(auVar31,auVar42);
      (*this->_adapter->_vptr_RelativeAdapterBase[3])(&local_128,this->_adapter,(long)iVar22);
      local_318 = auVar25._0_8_;
      dStack_310 = auVar25._8_8_;
      local_2f8 = auVar24._0_8_;
      dStack_2f0 = auVar24._8_8_;
      (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [uVar23] = (1.0 - (local_318 * (double)local_208._0_8_ + dStack_310 * (double)local_208._8_8_
                        + dVar33 * local_1f8)) +
                 (1.0 - (local_2f8 * local_128 + dStack_2f0 * dStack_120 +
                        (dVar4 / dVar34) * local_118));
      uVar23 = uVar23 + 1;
      pIVar20 = this->_indices;
    } while (uVar23 < pIVar20->_numberCorrespondences);
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    translation_t translation = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    rotation_t rotation = math::cayley2rot(cayley);

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for( size_t i = 0; i < _indices.size(); i++ )
    {
      translation_t cam1Offset = _adapter.getCamOffset1(_indices[i]);
      rotation_t cam1Rotation = _adapter.getCamRotation1(_indices[i]);
      translation_t cam2Offset = _adapter.getCamOffset2(_indices[i]);
      rotation_t cam2Rotation = _adapter.getCamRotation2(_indices[i]);

      translation_t directTranslation =
          cam1Rotation.transpose() *
          ((translation - cam1Offset) + rotation * cam2Offset);
      rotation_t directRotation =
          cam1Rotation.transpose() * rotation * cam2Rotation;

      _adapter.sett12(directTranslation);
      _adapter.setR12(directRotation);

      transformation_t inverseSolution;
      inverseSolution.block<3,3>(0,0) = directRotation.transpose();
      inverseSolution.col(3) =
          -inverseSolution.block<3,3>(0,0)*directTranslation;

      p_hom.block<3,1>(0,0) =
          opengv::triangulation::triangulate2(_adapter,_indices[i]);
      bearingVector_t reprojection1 = p_hom.block<3,1>(0,0);
      bearingVector_t reprojection2 = inverseSolution * p_hom;
      reprojection1 = reprojection1 / reprojection1.norm();
      reprojection2 = reprojection2 / reprojection2.norm();
      bearingVector_t f1 = _adapter.getBearingVector1(_indices[i]);
      bearingVector_t f2 = _adapter.getBearingVector2(_indices[i]);

      //bearing-vector based outlier criterium (select threshold accordingly):
      //1-(f1'*f2) = 1-cos(alpha) \in [0:2]
      double reprojError1 = 1.0 - (f1.transpose() * reprojection1);
      double reprojError2 = 1.0 - (f2.transpose() * reprojection2);
      double factor = 1.0;
      fvec[i] = factor*(reprojError1 + reprojError2);
    }

    return 0;
  }